

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  ostream *poVar6;
  reference pvVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  long lStack_480;
  msg msgkun;
  allocator<char> local_471;
  string local_470;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opt_cmd_ls;
  string local_438;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_418;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_400;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b8;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  parser p;
  
  msgkun = (msg)0x0;
  plVar5 = (long *)operator_new(8);
  p.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p.options._M_t._M_impl.super__Rb_tree_header._M_header;
  p.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p.ftr._M_dataplus._M_p = (pointer)&p.ftr.field_2;
  p.options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p.ordered.
  super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  p.ordered.
  super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p.ordered.
  super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p.ftr._M_string_length = 0;
  *plVar5 = (long)&PTR__PmWrapperInterface_0010fd18;
  p.ftr.field_2._M_local_buf[0] = '\0';
  p.prog_name._M_dataplus._M_p = (pointer)&p.prog_name.field_2;
  p.prog_name._M_string_length = 0;
  p.prog_name.field_2._M_local_buf[0] = '\0';
  p.others.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  p.others.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p.others.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  p.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       p.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"aptdnf",(allocator<char> *)&local_438);
  std::__cxx11::string::_M_assign((string *)&p.prog_name);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"version",(allocator<char> *)&opt_cmd_ls);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"show version",&local_471)
  ;
  cmdline::parser::add(&p,&local_470,'v',&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"yes",(allocator<char> *)&opt_cmd_ls);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"no confirm",&local_471);
  cmdline::parser::add(&p,&local_470,'y',&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"assume-yes",(allocator<char> *)&opt_cmd_ls);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"no confirm",&local_471);
  cmdline::parser::add(&p,&local_470,'\0',&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"download-only",(allocator<char> *)&opt_cmd_ls);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,"Only download the package.",&local_471);
  cmdline::parser::add(&p,&local_470,'d',&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"purge",(allocator<char> *)&opt_cmd_ls);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,"Delete the entire configuration file.",&local_471);
  cmdline::parser::add(&p,&local_470,'\0',&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"help",(allocator<char> *)&opt_cmd_ls);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"show help",&local_471);
  cmdline::parser::add(&p,&local_470,'h',&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_470);
  bVar1 = cmdline::parser::parse(&p,argc,argv);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_470,"help",(allocator<char> *)&local_438);
    bVar1 = cmdline::parser::exist(&p,&local_470);
    std::__cxx11::string::~string((string *)&local_470);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,"version",(allocator<char> *)&local_438);
      bVar1 = cmdline::parser::exist(&p,&local_470);
      std::__cxx11::string::~string((string *)&local_470);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"aptdnf",(allocator<char> *)&local_438);
        (**(code **)(*plVar5 + 0x68))(&local_470,plVar5);
        std::operator+(&local_120,"Version : ",&local_470);
        iVar4 = 0;
        FascodeUtil::msg::print(&msgkun,INFO,&local_100,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_470);
        std::__cxx11::string::~string((string *)&local_100);
        goto LAB_0010788f;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,"yes",(allocator<char> *)&local_438);
      bVar1 = cmdline::parser::exist(&p,&local_470);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,"assume-yes",(allocator<char> *)&local_438);
      bVar2 = cmdline::parser::exist(&p,&local_470);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,"download-only",(allocator<char> *)&local_438);
      bVar3 = cmdline::parser::exist(&p,&local_470);
      std::__cxx11::string::~string((string *)&local_470);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&opt_cmd_ls,&p.others);
      if (opt_cmd_ls.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          opt_cmd_ls.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        cmdline::parser::error_full_abi_cxx11_(&local_470,&p);
        poVar6 = std::operator<<((ostream *)&std::cout,(string *)&local_470);
        cmdline::parser::usage_abi_cxx11_(&local_438,&p);
        std::operator<<(poVar6,(string *)&local_438);
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::string::~string((string *)&local_470);
        iVar4 = 0;
      }
      else {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at(&opt_cmd_ls,0);
        bVar1 = bVar1 || bVar2;
        bVar2 = std::operator==(pvVar7,"install");
        if (bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_140,"aptdnf",(allocator<char> *)&local_470);
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at(&opt_cmd_ls,0);
          std::__cxx11::string::string((string *)&local_160,(string *)pvVar7);
          FascodeUtil::msg::print(&msgkun,DEBUG,&local_140,&local_160);
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)&local_140);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::erase(&opt_cmd_ls,
                  (const_iterator)
                  opt_cmd_ls.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_3b8,&opt_cmd_ls);
          iVar4 = (**(code **)(*plVar5 + 0x10))(plVar5,&local_3b8,CONCAT11(bVar3,bVar1));
          this = &local_3b8;
        }
        else {
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at(&opt_cmd_ls,0);
          bVar2 = std::operator==(pvVar7,"update");
          if (bVar2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_180,"aptdnf",(allocator<char> *)&local_470);
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::at(&opt_cmd_ls,0);
            std::__cxx11::string::string((string *)&local_1a0,(string *)pvVar7);
            FascodeUtil::msg::print(&msgkun,DEBUG,&local_180,&local_1a0);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::~string((string *)&local_180);
            lStack_480 = 0x28;
LAB_00107c12:
            iVar4 = (**(code **)(*plVar5 + lStack_480))(plVar5,CONCAT11(bVar3,bVar1));
            goto LAB_00107c29;
          }
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at(&opt_cmd_ls,0);
          bVar2 = std::operator==(pvVar7,"upgrade");
          if (bVar2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1c0,"aptdnf",(allocator<char> *)&local_470);
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::at(&opt_cmd_ls,0);
            std::__cxx11::string::string((string *)&local_1e0,(string *)pvVar7);
            FascodeUtil::msg::print(&msgkun,DEBUG,&local_1c0,&local_1e0);
            std::__cxx11::string::~string((string *)&local_1e0);
            std::__cxx11::string::~string((string *)&local_1c0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::erase(&opt_cmd_ls,
                    (const_iterator)
                    opt_cmd_ls.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_3d0,&opt_cmd_ls);
            iVar4 = (**(code **)(*plVar5 + 0x10))(plVar5,&local_3d0,CONCAT11(bVar3,bVar1));
            this = &local_3d0;
          }
          else {
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::at(&opt_cmd_ls,0);
            bVar2 = std::operator==(pvVar7,"remove");
            if (bVar2) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_200,"aptdnf",(allocator<char> *)&local_470);
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::at(&opt_cmd_ls,0);
              std::__cxx11::string::string((string *)&local_220,(string *)pvVar7);
              FascodeUtil::msg::print(&msgkun,DEBUG,&local_200,&local_220);
              std::__cxx11::string::~string((string *)&local_220);
              std::__cxx11::string::~string((string *)&local_200);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::erase(&opt_cmd_ls,
                      (const_iterator)
                      opt_cmd_ls.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_3e8,&opt_cmd_ls);
              iVar4 = (**(code **)(*plVar5 + 0x18))(plVar5,&local_3e8,CONCAT11(bVar3,bVar1));
              this = &local_3e8;
            }
            else {
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::at(&opt_cmd_ls,0);
              bVar2 = std::operator==(pvVar7,"purge");
              if (bVar2) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_240,"aptdnf",(allocator<char> *)&local_470);
                pvVar7 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::at(&opt_cmd_ls,0);
                std::__cxx11::string::string((string *)&local_260,(string *)pvVar7);
                FascodeUtil::msg::print(&msgkun,DEBUG,&local_240,&local_260);
                std::__cxx11::string::~string((string *)&local_260);
                std::__cxx11::string::~string((string *)&local_240);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase(&opt_cmd_ls,
                        (const_iterator)
                        opt_cmd_ls.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_400,&opt_cmd_ls);
                iVar4 = (**(code **)(*plVar5 + 0x20))(plVar5,&local_400,CONCAT11(bVar3,bVar1));
                this = &local_400;
              }
              else {
                pvVar7 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::at(&opt_cmd_ls,0);
                bVar2 = std::operator==(pvVar7,"search");
                if (!bVar2) {
                  pvVar7 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::at(&opt_cmd_ls,0);
                  bVar2 = std::operator==(pvVar7,"full-upgrade");
                  if (bVar2) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_2c0,"aptdnf",(allocator<char> *)&local_470);
                    pvVar7 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::at(&opt_cmd_ls,0);
                    std::__cxx11::string::string((string *)&local_2e0,(string *)pvVar7);
                    FascodeUtil::msg::print(&msgkun,DEBUG,&local_2c0,&local_2e0);
                    std::__cxx11::string::~string((string *)&local_2e0);
                    std::__cxx11::string::~string((string *)&local_2c0);
                    lStack_480 = 0x40;
                  }
                  else {
                    pvVar7 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::at(&opt_cmd_ls,0);
                    bVar2 = std::operator==(pvVar7,"dist-upgrade");
                    if (bVar2) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_300,"aptdnf",(allocator<char> *)&local_470);
                      pvVar7 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::at(&opt_cmd_ls,0);
                      std::__cxx11::string::string((string *)&local_320,(string *)pvVar7);
                      FascodeUtil::msg::print(&msgkun,DEBUG,&local_300,&local_320);
                      std::__cxx11::string::~string((string *)&local_320);
                      std::__cxx11::string::~string((string *)&local_300);
                      lStack_480 = 0x50;
                    }
                    else {
                      pvVar7 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::at(&opt_cmd_ls,0);
                      bVar2 = std::operator==(pvVar7,"edit-sources");
                      if (bVar2) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_340,"aptdnf",(allocator<char> *)&local_470);
                        pvVar7 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::at(&opt_cmd_ls,0);
                        std::__cxx11::string::string((string *)&local_360,(string *)pvVar7);
                        FascodeUtil::msg::print(&msgkun,DEBUG,&local_340,&local_360);
                        std::__cxx11::string::~string((string *)&local_360);
                        std::__cxx11::string::~string((string *)&local_340);
                        lStack_480 = 0x48;
                      }
                      else {
                        iVar4 = 0;
                        pvVar7 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::at(&opt_cmd_ls,0);
                        bVar2 = std::operator==(pvVar7,"autoremove");
                        if (!bVar2) goto LAB_00107c29;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_380,"aptdnf",(allocator<char> *)&local_470);
                        pvVar7 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::at(&opt_cmd_ls,0);
                        std::__cxx11::string::string((string *)&local_3a0,(string *)pvVar7);
                        FascodeUtil::msg::print(&msgkun,DEBUG,&local_380,&local_3a0);
                        std::__cxx11::string::~string((string *)&local_3a0);
                        std::__cxx11::string::~string((string *)&local_380);
                        lStack_480 = 0x58;
                      }
                    }
                  }
                  goto LAB_00107c12;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_280,"aptdnf",(allocator<char> *)&local_470);
                pvVar7 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::at(&opt_cmd_ls,0);
                std::__cxx11::string::string((string *)&local_2a0,(string *)pvVar7);
                FascodeUtil::msg::print(&msgkun,DEBUG,&local_280,&local_2a0);
                std::__cxx11::string::~string((string *)&local_2a0);
                std::__cxx11::string::~string((string *)&local_280);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase(&opt_cmd_ls,
                        (const_iterator)
                        opt_cmd_ls.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_418,&opt_cmd_ls);
                iVar4 = (**(code **)(*plVar5 + 0x38))(plVar5,&local_418,CONCAT11(bVar3,bVar1));
                this = &local_418;
              }
            }
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(this);
      }
LAB_00107c29:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&opt_cmd_ls);
      goto LAB_0010788f;
    }
  }
  cmdline::parser::error_full_abi_cxx11_(&local_470,&p);
  poVar6 = std::operator<<((ostream *)&std::cout,(string *)&local_470);
  cmdline::parser::usage_abi_cxx11_(&local_438,&p);
  std::operator<<(poVar6,(string *)&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_470);
  iVar4 = 0;
LAB_0010788f:
  cmdline::parser::~parser(&p);
  return iVar4;
}

Assistant:

int main(int argc,char* argv[]){
    FascodeUtil::msg msgkun=FascodeUtil::msg();
    PmWrapperInterface * pmwrapper=new dnf_control;
    PmWrapper_pkgoptions optkunniki;
    optkunniki.downloadonly=false;
    optkunniki.noconfirm=false;
    cmdline::parser p;
    p.set_program_name("aptdnf");
    p.add("version",'v',"show version");
    p.add("yes",'y',"no confirm");
    p.add("assume-yes",0,"no confirm");
    p.add("download-only",'d',"Only download the package.");
    p.add("purge",0,"Delete the entire configuration file.");
    p.add("help",'h',"show help");
    if (!p.parse(argc, argv)||p.exist("help")){
        std::cout<<p.error_full()<<p.usage();
        return 0;
    }
    if(p.exist("version")){
        msgkun.print(FascodeUtil::INFO,"aptdnf","Version : " + pmwrapper->get_core_info());
        return 0;
    }
    if(p.exist("yes")){
        optkunniki.noconfirm=true;
    }
    if(p.exist("assume-yes")){
        optkunniki.noconfirm=true;
    }
    if(p.exist("download-only")){
        optkunniki.downloadonly=true;
    }
    std::vector<std::string> opt_cmd_ls=p.rest();
    if(opt_cmd_ls.size() == 0){
        std::cout<<p.error_full()<<p.usage();
        return 0;
    }
    if(opt_cmd_ls.at(0) == "install") {
        msgkun.print(FascodeUtil::DEBUG,"aptdnf",opt_cmd_ls.at(0));
        opt_cmd_ls.erase(opt_cmd_ls.begin());
        return pmwrapper->Install(opt_cmd_ls,optkunniki);
    }
    if(opt_cmd_ls.at(0) == "update") {
        msgkun.print(FascodeUtil::DEBUG,"aptdnf",opt_cmd_ls.at(0));
        return pmwrapper->Update(optkunniki);
    }
    if(opt_cmd_ls.at(0) == "upgrade") {
        msgkun.print(FascodeUtil::DEBUG,"aptdnf",opt_cmd_ls.at(0));
        opt_cmd_ls.erase(opt_cmd_ls.begin());
        return pmwrapper->Install(opt_cmd_ls,optkunniki);
    }
    if(opt_cmd_ls.at(0) == "remove") {
        msgkun.print(FascodeUtil::DEBUG,"aptdnf",opt_cmd_ls.at(0));
        opt_cmd_ls.erase(opt_cmd_ls.begin());
        return pmwrapper->Remove(opt_cmd_ls,optkunniki);
    }
    if(opt_cmd_ls.at(0) == "purge") {
        msgkun.print(FascodeUtil::DEBUG,"aptdnf",opt_cmd_ls.at(0));
        opt_cmd_ls.erase(opt_cmd_ls.begin());
        return pmwrapper->Purge(opt_cmd_ls,optkunniki);
    }
    if(opt_cmd_ls.at(0) == "search") {
        msgkun.print(FascodeUtil::DEBUG,"aptdnf",opt_cmd_ls.at(0));
        opt_cmd_ls.erase(opt_cmd_ls.begin());
        return pmwrapper->Search(opt_cmd_ls,optkunniki);
    }
    if(opt_cmd_ls.at(0) == "full-upgrade") {
        msgkun.print(FascodeUtil::DEBUG,"aptdnf",opt_cmd_ls.at(0));
        return pmwrapper->Full_Upgrade(optkunniki);
    }
    if(opt_cmd_ls.at(0) == "dist-upgrade") {
        msgkun.print(FascodeUtil::DEBUG,"aptdnf",opt_cmd_ls.at(0));
        return pmwrapper->Dist_Upgrade(optkunniki);
    }

    if(opt_cmd_ls.at(0) == "edit-sources") {
        msgkun.print(FascodeUtil::DEBUG,"aptdnf",opt_cmd_ls.at(0));
        return pmwrapper->Edit_sources(optkunniki);
    }
    if(opt_cmd_ls.at(0) == "autoremove") {
        msgkun.print(FascodeUtil::DEBUG,"aptdnf",opt_cmd_ls.at(0));
        return pmwrapper->Autoremove(optkunniki);
    }



    return 0;
}